

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O2

void pg::pm_stream(ostream *out,int *pm,int k)

{
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if ((uint)(~(k >> 0x1f) & k) == uVar3) {
      return;
    }
    if (pm[uVar3] == -1) {
      pcVar2 = " __";
LAB_0015a8ab:
      std::operator<<(out,pcVar2);
    }
    else {
      if (uVar3 == 0) {
        std::operator<<(out,"\x1b[33;1m");
        poVar1 = std::operator<<(out," ");
        poVar1 = std::operator<<(poVar1,0x30);
        *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 2;
        std::ostream::operator<<(poVar1,*pm);
        pcVar2 = "\x1b[m";
        goto LAB_0015a8ab;
      }
      poVar1 = std::operator<<(out," ");
      poVar1 = std::operator<<(poVar1,0x30);
      *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 2;
      std::ostream::operator<<(poVar1,pm[uVar3]);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static void
pm_stream(std::ostream &out, int *pm, int k)
{
    for (int i=0; i<k; i++) {
        if (pm[i] != -1) {
            if (i == 0) out << "\033[33;1m";
            out << " " << std::setfill('0') << std::setw(2) << pm[i];
            if (i == 0) out << "\033[m";
        }
        else out << " __";
    }
}